

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label.cpp
# Opt level: O0

string_view __thiscall jhu::thrax::SAMTLabeler::operator()(SAMTLabeler *this,SpanPair nt)

{
  bool bVar1;
  pointer pCVar2;
  string_view sVar3;
  bool local_fd;
  value_type local_f0;
  const_iterator local_c8;
  __normal_iterator<jhu::thrax::CachedLabel_*,_std::vector<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>_>
  local_c0;
  SpanPair local_b8;
  SAMTLabel local_b0;
  LabelVisitor local_71;
  undefined1 local_70 [8];
  __visit_result_t<jhu::thrax::(anonymous_namespace)::LabelVisitor,_std::variant<jhu::thrax::(anonymous_namespace)::Constituent,_jhu::thrax::(anonymous_namespace)::ForwardApply,_jhu::thrax::(anonymous_namespace)::BackwardApply,_jhu::thrax::(anonymous_namespace)::Concat,_jhu::thrax::(anonymous_namespace)::DoubleConcat>_>
  result;
  __normal_iterator<jhu::thrax::CachedLabel_*,_std::vector<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>_>
  local_48;
  CachedLabel *local_40;
  __normal_iterator<jhu::thrax::CachedLabel_*,_std::vector<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>_>
  local_38;
  __normal_iterator<jhu::thrax::CachedLabel_*,_std::vector<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>_>
  local_30;
  __normal_iterator<jhu::thrax::CachedLabel_*,_std::vector<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>_>
  it;
  SAMTLabeler *this_local;
  SpanPair nt_local;
  
  this_local._4_4_ = nt.tgt;
  (this->key_).span = this_local._4_4_;
  it._M_current = (CachedLabel *)this;
  local_38._M_current =
       (CachedLabel *)
       std::vector<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>::begin
                 (&this->cache_);
  local_40 = (CachedLabel *)
             std::vector<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>::end
                       (&this->cache_);
  local_30 = std::
             lower_bound<__gnu_cxx::__normal_iterator<jhu::thrax::CachedLabel*,std::vector<jhu::thrax::CachedLabel,std::allocator<jhu::thrax::CachedLabel>>>,jhu::thrax::CachedLabel,bool(*)(jhu::thrax::CachedLabel_const&,jhu::thrax::CachedLabel_const&)>
                       (local_38,(__normal_iterator<jhu::thrax::CachedLabel_*,_std::vector<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>_>
                                  )local_40,&this->key_,anon_unknown_0::spanOrder);
  local_48._M_current =
       (CachedLabel *)
       std::vector<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>::end
                 (&this->cache_);
  bVar1 = __gnu_cxx::operator!=(&local_30,&local_48);
  local_fd = false;
  if (bVar1) {
    pCVar2 = __gnu_cxx::
             __normal_iterator<jhu::thrax::CachedLabel_*,_std::vector<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>_>
             ::operator->(&local_30);
    result.field_2._12_2_ = this_local._4_2_;
    result.field_2._14_2_ = this_local._6_2_;
    local_fd = Span::operator==(&pCVar2->span,this_local._4_4_);
  }
  if (local_fd == false) {
    local_b8 = nt;
    anon_unknown_0::label(&local_b0,&this->tree_,nt);
    std::
    visit_abi_cxx11_<jhu::thrax::(anonymous_namespace)::LabelVisitor,std::variant<jhu::thrax::(anonymous_namespace)::Constituent,jhu::thrax::(anonymous_namespace)::ForwardApply,jhu::thrax::(anonymous_namespace)::BackwardApply,jhu::thrax::(anonymous_namespace)::Concat,jhu::thrax::(anonymous_namespace)::DoubleConcat>>
              ((__visit_result_t<jhu::thrax::(anonymous_namespace)::LabelVisitor,_std::variant<jhu::thrax::(anonymous_namespace)::Constituent,_jhu::thrax::(anonymous_namespace)::ForwardApply,_jhu::thrax::(anonymous_namespace)::BackwardApply,_jhu::thrax::(anonymous_namespace)::Concat,_jhu::thrax::(anonymous_namespace)::DoubleConcat>_>
                *)local_70,&local_71,&local_b0);
    __gnu_cxx::
    __normal_iterator<jhu::thrax::CachedLabel_const*,std::vector<jhu::thrax::CachedLabel,std::allocator<jhu::thrax::CachedLabel>>>
    ::__normal_iterator<jhu::thrax::CachedLabel*>
              ((__normal_iterator<jhu::thrax::CachedLabel_const*,std::vector<jhu::thrax::CachedLabel,std::allocator<jhu::thrax::CachedLabel>>>
                *)&local_c8,&local_30);
    local_f0.span = this_local._4_4_;
    std::__cxx11::string::string((string *)&local_f0.label,(string *)local_70);
    local_c0._M_current =
         (CachedLabel *)
         std::vector<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>::insert
                   (&this->cache_,local_c8,&local_f0);
    pCVar2 = __gnu_cxx::
             __normal_iterator<jhu::thrax::CachedLabel_*,_std::vector<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>_>
             ::operator->(&local_c0);
    sVar3 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&pCVar2->label);
    CachedLabel::~CachedLabel(&local_f0);
    std::__cxx11::string::~string((string *)local_70);
  }
  else {
    pCVar2 = __gnu_cxx::
             __normal_iterator<jhu::thrax::CachedLabel_*,_std::vector<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>_>
             ::operator->(&local_30);
    sVar3 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&pCVar2->label);
  }
  return sVar3;
}

Assistant:

std::string_view SAMTLabeler::operator()(SpanPair nt) const {
  key_.span = nt.tgt;
  auto it = std::lower_bound(cache_.begin(), cache_.end(), key_, spanOrder);
  if (it != cache_.end() && it->span == nt.tgt) {
    return it->label;
  }
  auto result = std::visit(LabelVisitor{}, label(tree_, nt));
  return cache_.insert(it, CachedLabel{ nt.tgt, result })->label;
}